

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  EncounteredNaNError *this_00;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6d,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((this->super_Matrix).m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6e,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar1 >> 2;
  if (lVar4 != (this->super_Matrix).n_) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6f,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if (lVar4 < 1) {
    auVar9 = ZEXT864(0);
  }
  else {
    pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = i * lVar4;
    uVar7 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
    uVar8 = 0;
    if (uVar5 <= uVar7) {
      uVar8 = uVar7 - uVar5;
    }
    if (uVar8 <= lVar4 - 1U) {
      __assert_fail("i * n_ + j < data_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.h"
                    ,0x30,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
    }
    auVar9 = ZEXT864(0);
    lVar6 = 0;
    do {
      auVar3 = vfmadd231ss_fma(auVar9._0_16_,ZEXT416((uint)pfVar2[uVar5 + lVar6]),
                               ZEXT416((uint)pfVar1[lVar6]));
      auVar9 = ZEXT1664(auVar3);
      lVar6 = lVar6 + 1;
    } while (lVar4 != lVar6);
    if (NAN(auVar3._0_4_)) {
      this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
      EncounteredNaNError::EncounteredNaNError(this_00);
      __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return auVar9._0_4_;
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw EncounteredNaNError();
  }
  return d;
}